

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

mat33 * nifti_mat33_mul(mat33 A,mat33 B)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float (*pafVar4) [3];
  int i;
  long lVar5;
  float (*in_RDI) [3];
  long lVar6;
  
  pafVar4 = in_RDI;
  lVar5 = 0;
  do {
    fVar1 = A.m[lVar5][0];
    fVar2 = A.m[lVar5][1];
    fVar3 = A.m[lVar5][2];
    lVar6 = 0;
    do {
      (*(float (*) [3])*in_RDI)[lVar6] =
           B.m[2][lVar6] * fVar3 + B.m[0][lVar6] * fVar1 + B.m[1][lVar6] * fVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar5 = lVar5 + 1;
    in_RDI = in_RDI + 1;
  } while (lVar5 != 3);
  return (mat33 *)pafVar4;
}

Assistant:

mat33 nifti_mat33_mul( mat33 A , mat33 B )  /* multiply 2 3x3 matrices */
{
   mat33 C ; int i,j ;
   for( i=0 ; i < 3 ; i++ )
    for( j=0 ; j < 3 ; j++ )
      C.m[i][j] =  A.m[i][0] * B.m[0][j]
                 + A.m[i][1] * B.m[1][j]
                 + A.m[i][2] * B.m[2][j] ;
   return C ;
}